

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error ft_stroke_border_grow(PVG_FT_StrokeBorder border,PVG_FT_UInt new_points)

{
  uint uVar1;
  PVG_FT_Vector *pPVar2;
  PVG_FT_Byte *pPVar3;
  uint local_24;
  PVG_FT_UInt cur_max;
  PVG_FT_Error error;
  PVG_FT_UInt new_max;
  PVG_FT_UInt old_max;
  PVG_FT_UInt new_points_local;
  PVG_FT_StrokeBorder border_local;
  
  local_24 = border->max_points;
  uVar1 = border->num_points + new_points;
  if (local_24 < uVar1) {
    for (; local_24 < uVar1; local_24 = (local_24 >> 1) + 0x10 + local_24) {
    }
    pPVar2 = (PVG_FT_Vector *)realloc(border->points,(ulong)local_24 << 4);
    border->points = pPVar2;
    pPVar3 = (PVG_FT_Byte *)realloc(border->tags,(ulong)local_24);
    border->tags = pPVar3;
    if ((border->points != (PVG_FT_Vector *)0x0) && (border->tags != (PVG_FT_Byte *)0x0)) {
      border->max_points = local_24;
    }
  }
  return 0;
}

Assistant:

static PVG_FT_Error ft_stroke_border_grow(PVG_FT_StrokeBorder border,
                                         PVG_FT_UInt         new_points)
{
    PVG_FT_UInt  old_max = border->max_points;
    PVG_FT_UInt  new_max = border->num_points + new_points;
    PVG_FT_Error error = 0;

    if (new_max > old_max) {
        PVG_FT_UInt cur_max = old_max;

        while (cur_max < new_max) cur_max += (cur_max >> 1) + 16;

        border->points = (PVG_FT_Vector*)realloc(border->points,
                                                cur_max * sizeof(PVG_FT_Vector));
        border->tags =
            (PVG_FT_Byte*)realloc(border->tags, cur_max * sizeof(PVG_FT_Byte));

        if (!border->points || !border->tags) goto Exit;

        border->max_points = cur_max;
    }

Exit:
    return error;
}